

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUITabControl::getTabAt(CGUITabControl *this,s32 xpos,s32 ypos)

{
  uint uVar1;
  bool bVar2;
  wchar_t wVar3;
  int iVar4;
  IGUITab **ppIVar5;
  int in_EDX;
  int in_ESI;
  wchar_t *in_RDI;
  s32 space;
  s32 len;
  wchar_t *text;
  s32 i;
  bool abort;
  s32 pos;
  rect<int> frameRect;
  IGUIFont *font;
  IGUISkin *skin;
  position2di p;
  u32 in_stack_ffffffffffffff7c;
  wchar_t wVar6;
  uint in_stack_ffffffffffffff84;
  rect<int> in_stack_ffffffffffffff90;
  int local_5c;
  wchar_t local_4c;
  undefined1 local_45;
  int local_44;
  rect<int> local_40;
  undefined8 local_30;
  long *local_28;
  vector2d<int> local_20 [3];
  wchar_t local_4;
  
  core::vector2d<int>::vector2d(local_20,in_ESI,in_EDX);
  local_28 = (long *)(**(code **)(**(long **)(in_RDI + 0x4a) + 0x60))();
  local_30 = (**(code **)(*local_28 + 0x30))(local_28,0);
  local_40.LowerRightCorner = *(vector2d<int> *)(in_RDI + 0x12);
  local_40.UpperLeftCorner.X = (int)*(undefined8 *)(in_RDI + 0x10);
  if (in_RDI[0x59] == L'\0') {
    local_40.UpperLeftCorner.Y = (int)((ulong)*(undefined8 *)(in_RDI + 0x10) >> 0x20);
    local_40.UpperLeftCorner.Y = local_40.UpperLeftCorner.Y + 2;
    local_40.LowerRightCorner.Y = local_40.UpperLeftCorner.Y + in_RDI[0x58];
  }
  else {
    local_40.UpperLeftCorner.Y = local_40.LowerRightCorner.Y - in_RDI[0x58];
  }
  local_44 = local_40.UpperLeftCorner.X + 2;
  bVar2 = core::rect<int>::isPointInside(&local_40,local_20);
  if (bVar2) {
    local_45 = 0;
    local_4c = in_RDI[0x5f];
    while( true ) {
      wVar6 = local_4c;
      wVar3 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3d17ea);
      uVar1 = in_stack_ffffffffffffff84 & 0xffffff;
      if (wVar6 < wVar3) {
        uVar1 = CONCAT13(local_45,(int3)in_stack_ffffffffffffff84) ^ 0xff000000;
      }
      in_stack_ffffffffffffff84 = uVar1;
      if ((in_stack_ffffffffffffff84 & 0x1000000) == 0) {
        return -1;
      }
      ppIVar5 = core::array<irr::gui::IGUITab_*>::operator[]
                          ((array<irr::gui::IGUITab_*> *)CONCAT44(in_stack_ffffffffffffff84,wVar6),
                           in_stack_ffffffffffffff7c);
      if (*ppIVar5 != (IGUITab *)0x0) {
        ppIVar5 = core::array<irr::gui::IGUITab_*>::operator[]
                            ((array<irr::gui::IGUITab_*> *)CONCAT44(in_stack_ffffffffffffff84,wVar6)
                             ,in_stack_ffffffffffffff7c);
        (*((*ppIVar5)->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])();
      }
      local_5c = calcTabWidth((CGUITabControl *)in_stack_ffffffffffffff90.LowerRightCorner,
                              (IGUIFont *)in_stack_ffffffffffffff90.UpperLeftCorner,in_RDI);
      if ((*(byte *)((long)in_RDI + 0x15e) & 1) != 0) {
        in_stack_ffffffffffffff90 =
             IGUIElement::getAbsolutePosition(*(IGUIElement **)(in_RDI + 0x5a));
        iVar4 = (in_stack_ffffffffffffff90.UpperLeftCorner.X + -2) - local_44;
        if (iVar4 < local_5c) {
          local_45 = 1;
          local_5c = iVar4;
        }
      }
      local_40.UpperLeftCorner.X = local_44;
      local_40.LowerRightCorner.X = local_44 + local_5c;
      local_44 = local_5c + local_44;
      bVar2 = core::rect<int>::isPointInside(&local_40,local_20);
      if (bVar2) break;
      local_4c = local_4c + L'\x01';
    }
    local_4 = local_4c;
  }
  else {
    local_4 = L'\xffffffff';
  }
  return local_4;
}

Assistant:

s32 CGUITabControl::getTabAt(s32 xpos, s32 ypos) const
{
	core::position2di p(xpos, ypos);
	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = skin->getFont();

	core::rect<s32> frameRect(AbsoluteRect);

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight;
	}

	s32 pos = frameRect.UpperLeftCorner.X + 2;

	if (!frameRect.isPointInside(p))
		return -1;

	bool abort = false;
	for (s32 i = CurrentScrollTabIndex; i < (s32)Tabs.size() && !abort; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			// TODO: merge this with draw() ?
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				abort = true;
				len = space;
			}
		}

		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if (frameRect.isPointInside(p)) {
			return i;
		}
	}
	return -1;
}